

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

uint cimg_library::cimg::sleep(uint __seconds)

{
  uint uVar1;
  undefined1 local_20 [8];
  timespec tv;
  uint milliseconds_local;
  
  local_20 = (undefined1  [8])((ulong)__seconds / 1000);
  tv.tv_sec = (__time_t)((__seconds % 1000) * 1000000);
  tv.tv_nsec._4_4_ = __seconds;
  uVar1 = nanosleep((timespec *)local_20,(timespec *)0x0);
  return uVar1;
}

Assistant:

inline void sleep(const unsigned int milliseconds) {
#if cimg_OS==1
      struct timespec tv;
      tv.tv_sec = milliseconds/1000;
      tv.tv_nsec = (milliseconds%1000)*1000000;
      nanosleep(&tv,0);
#elif cimg_OS==2
      Sleep(milliseconds);
#else
      cimg::unused(milliseconds);
#endif
    }